

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int send_certificate_and_certificate_verify
              (ptls_t *tls,ptls_message_emitter_t *emitter,
              st_ptls_signature_algorithms_t *signature_algorithms,ptls_iovec_t context,
              char *context_string,int push_status_request)

{
  ptls_buffer_t *ppVar1;
  ptls_key_schedule_t *ppVar2;
  st_ptls_sign_certificate_t *psVar3;
  ptls_buffer_t *buf;
  uint8_t *puVar4;
  int iVar5;
  ptls_private_key_result_t pVar6;
  size_t sVar7;
  long lVar8;
  ptls_context_t *ppVar9;
  byte bVar10;
  ptls_message_emitter_t *_emitter;
  size_t sVar11;
  ptls_emit_certificate_t *ppVar12;
  ptls_hash_context_t **pppVar13;
  ptls_buffer_t *buf_00;
  uint8_t *puVar14;
  ptls_iovec_t pVar15;
  ptls_iovec_t pVar16;
  uint16_t algo_1;
  uint16_t algo;
  ptls_buffer_t *local_240;
  size_t local_238;
  size_t local_230;
  size_t local_228;
  size_t local_220;
  ptls_key_schedule_t *local_218;
  ptls_key_schedule_t *local_210;
  uint8_t data [226];
  uint8_t handshake_data [226];
  
  ppVar9 = tls->ctx;
  ppVar12 = &send_certificate_and_certificate_verify::default_emit_certificate;
  if (ppVar9->emit_certificate != (ptls_emit_certificate_t *)0x0) {
    ppVar12 = ppVar9->emit_certificate;
  }
  if ((tls->field_0x160 & 0x20) == 0) {
    if (signature_algorithms->count == 0) {
      return 0x6d;
    }
    iVar5 = (*ppVar12->cb)(ppVar12,tls,emitter,tls->key_schedule,context,push_status_request);
    if (iVar5 != 0) {
      return iVar5;
    }
    ppVar9 = tls->ctx;
    if (ppVar9->sign_certificate == (ptls_sign_certificate_t *)0x0) {
      return 0;
    }
    if ((ppVar9->private_key_method == (ptls_private_key_method_t *)0x0) ||
       (bVar10 = tls->field_0x160, (bVar10 & 1) == 0)) {
      iVar5 = (*emitter->begin_message)(emitter);
      if (iVar5 != 0) {
        return iVar5;
      }
      ppVar1 = emitter->buf;
      local_210 = tls->key_schedule;
      ppVar2 = (ptls_key_schedule_t *)ppVar1->off;
      iVar5 = ptls_buffer_reserve(ppVar1,1);
      if (iVar5 != 0) {
        return iVar5;
      }
      ppVar1->base[ppVar1->off] = '\x0f';
      ppVar1->off = ppVar1->off + 1;
      local_218 = ppVar2;
      iVar5 = ptls_buffer_reserve(ppVar1,3);
      if (iVar5 != 0) {
        return iVar5;
      }
      puVar14 = ppVar1->base;
      sVar11 = ppVar1->off;
      puVar14[sVar11 + 2] = '\0';
      puVar14 = puVar14 + sVar11;
      puVar14[0] = '\0';
      puVar14[1] = '\0';
      sVar11 = ppVar1->off;
      local_220 = sVar11 + 3;
      ppVar1->off = local_220;
      local_240 = emitter->buf;
      local_228 = local_240->off;
      iVar5 = ptls_buffer_reserve(local_240,2);
      if (iVar5 != 0) {
        return iVar5;
      }
      puVar14 = local_240->base;
      sVar7 = local_240->off;
      (puVar14 + sVar7)[0] = '\0';
      (puVar14 + sVar7)[1] = '\0';
      local_240->off = local_240->off + 2;
      iVar5 = ptls_buffer_reserve(local_240,2);
      if (iVar5 != 0) {
        return iVar5;
      }
      puVar14 = local_240->base;
      sVar7 = local_240->off;
      (puVar14 + sVar7)[0] = '\0';
      (puVar14 + sVar7)[1] = '\0';
      local_230 = local_240->off;
      local_238 = local_230 + 2;
      local_240->off = local_238;
      sVar7 = build_certificate_verify_signdata(data,tls->key_schedule,context_string);
      psVar3 = tls->ctx->sign_certificate;
      pVar15.len = sVar7;
      pVar15.base = data;
      iVar5 = (*psVar3->cb)(psVar3,tls,&algo,local_240,pVar15,signature_algorithms->list,
                            signature_algorithms->count);
      ppVar2 = local_210;
      if (iVar5 != 0) {
        return iVar5;
      }
      local_240->base[local_228] = algo._1_1_;
      local_240->base[local_228 + 1] = (uint8_t)algo;
      lVar8 = local_240->off - local_238;
      local_240->base[local_230] = (uint8_t)((ulong)lVar8 >> 8);
      local_240->base[local_230 + 1] = (uint8_t)lVar8;
      sVar7 = ppVar1->off;
      lVar8 = 0x10;
      do {
        ppVar1->base[sVar11] = (uint8_t)(sVar7 - local_220 >> ((byte)lVar8 & 0x3f));
        lVar8 = lVar8 + -8;
        sVar11 = sVar11 + 1;
      } while (lVar8 != -8);
      if ((local_210 != (ptls_key_schedule_t *)0x0) && (local_210->num_hashes != 0)) {
        puVar14 = ppVar1->base;
        puVar4 = local_218->secret;
        sVar7 = ppVar1->off - (long)local_218;
        pppVar13 = &local_210->hashes[0].ctx;
        sVar11 = 0;
        do {
          (*(*pppVar13)->update)(*pppVar13,puVar4 + (long)(puVar14 + -0x10),sVar7);
          sVar11 = sVar11 + 1;
          pppVar13 = pppVar13 + 2;
        } while (sVar11 != ppVar2->num_hashes);
      }
      goto LAB_0011ac2b;
    }
    if ((bVar10 & 0x20) == 0) {
      (tls->handshake_buf).base = "";
      (tls->handshake_buf).capacity = 0;
      (tls->handshake_buf).off = 0;
      (tls->handshake_buf).is_allocated = 0;
      sVar11 = build_certificate_verify_signdata(handshake_data,tls->key_schedule,context_string);
      bVar10 = tls->field_0x160;
      ppVar9 = tls->ctx;
    }
    else {
      sVar11 = 0;
    }
    if ((bVar10 & 0x20) != 0) goto LAB_0011a9fe;
    pVar16.len = sVar11;
    pVar16.base = handshake_data;
    pVar6 = (*ppVar9->private_key_method->sign)
                      (ppVar9->sign_certificate,tls,&algo_1,&tls->handshake_buf,pVar16,
                       signature_algorithms->list,signature_algorithms->count);
  }
  else {
LAB_0011a9fe:
    pVar6 = (*ppVar9->private_key_method->complete)
                      (ppVar9->sign_certificate,tls,&algo_1,&tls->handshake_buf);
  }
  if (pVar6 == ptls_private_key_failure) {
    tls->field_0x160 = tls->field_0x160 & 0xdf;
    return 0x209;
  }
  if (pVar6 == ptls_private_key_retry) {
    tls->field_0x160 = tls->field_0x160 | 0x20;
    return 0x202;
  }
  if (pVar6 != ptls_private_key_success) {
    return 0;
  }
  tls->field_0x160 = tls->field_0x160 & 0xdf;
  iVar5 = (*emitter->begin_message)(emitter);
  if (iVar5 != 0) {
    return iVar5;
  }
  ppVar1 = emitter->buf;
  ppVar2 = tls->key_schedule;
  sVar11 = ppVar1->off;
  iVar5 = ptls_buffer_reserve(ppVar1,1);
  if (iVar5 != 0) {
    return iVar5;
  }
  ppVar1->base[ppVar1->off] = '\x0f';
  ppVar1->off = ppVar1->off + 1;
  iVar5 = ptls_buffer_reserve(ppVar1,3);
  if (iVar5 != 0) {
    return iVar5;
  }
  puVar14 = ppVar1->base;
  sVar7 = ppVar1->off;
  puVar14[sVar7 + 2] = '\0';
  puVar14 = puVar14 + sVar7;
  puVar14[0] = '\0';
  puVar14[1] = '\0';
  sVar7 = ppVar1->off;
  ppVar1->off = sVar7 + 3;
  buf = emitter->buf;
  local_240 = (ptls_buffer_t *)buf->off;
  local_210 = (ptls_key_schedule_t *)(tls->handshake_buf).off;
  local_220 = sVar11;
  local_218 = ppVar2;
  iVar5 = ptls_buffer_reserve(buf,2);
  if (iVar5 != 0) {
    return iVar5;
  }
  puVar14 = buf->base;
  sVar11 = buf->off;
  (puVar14 + sVar11)[0] = '\0';
  (puVar14 + sVar11)[1] = '\0';
  buf->off = buf->off + 2;
  local_228 = sVar7 + 3;
  iVar5 = ptls_buffer_reserve(buf,2);
  ppVar2 = local_210;
  if (iVar5 != 0) {
    return iVar5;
  }
  puVar14 = buf->base;
  sVar11 = buf->off;
  (puVar14 + sVar11)[0] = '\0';
  (puVar14 + sVar11)[1] = '\0';
  local_230 = buf->off;
  local_238 = local_230 + 2;
  buf->off = local_238;
  iVar5 = ptls_buffer_reserve(buf,(size_t)local_210);
  if (iVar5 != 0) {
    return iVar5;
  }
  buf_00 = &tls->handshake_buf;
  memcpy(buf->base + buf->off,buf_00->base,(size_t)ppVar2);
  buf->off = (size_t)(ppVar2->secret + (buf->off - 0x10));
  ptls_buffer__release_memory(buf_00);
  ppVar2 = local_218;
  (tls->handshake_buf).off = 0;
  *(undefined8 *)&(tls->handshake_buf).is_allocated = 0;
  buf_00->base = (uint8_t *)0x0;
  (tls->handshake_buf).capacity = 0;
  *(uint8_t *)((long)&local_240->base + (long)buf->base) = algo_1._1_1_;
  *(uint8_t *)((long)&local_240->base + (long)(buf->base + 1)) = (uint8_t)algo_1;
  lVar8 = buf->off - local_238;
  buf->base[local_230] = (uint8_t)((ulong)lVar8 >> 8);
  buf->base[local_230 + 1] = (uint8_t)lVar8;
  sVar11 = ppVar1->off;
  lVar8 = 0x10;
  do {
    ppVar1->base[sVar7] = (uint8_t)(sVar11 - local_228 >> ((byte)lVar8 & 0x3f));
    lVar8 = lVar8 + -8;
    sVar7 = sVar7 + 1;
  } while (lVar8 != -8);
  if ((local_218 != (ptls_key_schedule_t *)0x0) && (local_218->num_hashes != 0)) {
    puVar14 = ppVar1->base + local_220;
    sVar7 = ppVar1->off - local_220;
    pppVar13 = &local_218->hashes[0].ctx;
    sVar11 = 0;
    do {
      (*(*pppVar13)->update)(*pppVar13,puVar14,sVar7);
      sVar11 = sVar11 + 1;
      pppVar13 = pppVar13 + 2;
    } while (sVar11 != ppVar2->num_hashes);
  }
LAB_0011ac2b:
  iVar5 = (*emitter->commit_message)(emitter);
  return iVar5;
}

Assistant:

static int send_certificate_and_certificate_verify(ptls_t *tls, ptls_message_emitter_t *emitter,
                                                   struct st_ptls_signature_algorithms_t *signature_algorithms,
                                                   ptls_iovec_t context, const char *context_string, int push_status_request)
{
    static ptls_emit_certificate_t default_emit_certificate = {default_emit_certificate_cb};
    ptls_emit_certificate_t *emit_certificate =
        tls->ctx->emit_certificate != NULL ? tls->ctx->emit_certificate : &default_emit_certificate;
    int ret;

    msg("send_certificate_and_certificate_verify");
    if (tls->in_handshake)
        goto resume_handshake;

    if (signature_algorithms->count == 0) {
        ret = PTLS_ALERT_MISSING_EXTENSION;
        goto Exit;
    }

    /* send Certificate (or the equivalent) */
    if ((ret = emit_certificate->cb(emit_certificate, tls, emitter, tls->key_schedule, context, push_status_request)) != 0)
        goto Exit;

    /* build and send CertificateVerify */
    if (tls->ctx->sign_certificate != NULL) {
        if ((tls->ctx->private_key_method) && (tls->is_server))
        {
            uint8_t  handshake_data[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
            size_t   handshake_len = 0;
            if (!tls->in_handshake)
            {
                ptls_buffer_init(&tls->handshake_buf, "", 0);
                handshake_len = build_certificate_verify_signdata(handshake_data, tls->key_schedule, context_string);
            }
            enum ptls_private_key_result_t res;
            uint16_t algo;
            if (!tls->in_handshake)
            {
                res = tls->ctx->private_key_method->sign(tls->ctx->sign_certificate,
                                                         tls, &algo, &tls->handshake_buf,
                                                         ptls_iovec_init(handshake_data, handshake_len),
                                                         signature_algorithms->list,
                                                         signature_algorithms->count);
            }
            else
resume_handshake:
                res = tls->ctx->private_key_method->complete(tls->ctx->sign_certificate,
                                                             tls, &algo, &tls->handshake_buf);
            switch (res)
            {
                case ptls_private_key_success:
                    msg("Completed private_key_method");
                    ret = 0;
                    tls->in_handshake = 0;

                    ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY,
                    {
                        ptls_buffer_t *sendbuf = emitter->buf;
                        size_t algo_off = sendbuf->off;
                        size_t siglen = tls->handshake_buf.off;
                        msg("signature len: %ld", siglen);
                        ptls_buffer_push16(sendbuf, 0); /* filled in later */
                        ptls_buffer_push_block(sendbuf, 2,
                        {
                            if ((ret = ptls_buffer_reserve(sendbuf, siglen)) != 0)
                            {
                                msg("Error reserving data space in signature");
                                goto Exit;
                            }
                            memcpy(sendbuf->base + sendbuf->off, tls->handshake_buf.base, siglen);
                            sendbuf->off += siglen;
                            ptls_buffer_dispose(&tls->handshake_buf);
                            sendbuf->base[algo_off] = (uint8_t)(algo >> 8);
                            sendbuf->base[algo_off + 1] = (uint8_t)algo;
                        });
                    });
                    break;
                case ptls_private_key_retry:
                    msg("Retry private_key_method");
                    ret = PTLS_ERROR_IN_PROGRESS;
                    tls->in_handshake = 1;
                    goto Exit;
                case ptls_private_key_failure:
                    msg("FAILED private_key_method");
                    ret = PTLS_ERROR_SIGN_FAILURE;
                    tls->in_handshake = 0;
                    goto Exit;
            }
        }
        else
            ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY, {
                ptls_buffer_t *sendbuf = emitter->buf;
                size_t algo_off = sendbuf->off;
                ptls_buffer_push16(sendbuf, 0); /* filled in later */
                ptls_buffer_push_block(sendbuf, 2, {
                    uint16_t algo;
                    uint8_t data[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
                    size_t datalen = build_certificate_verify_signdata(data, tls->key_schedule, context_string);
                    if ((ret = tls->ctx->sign_certificate->cb(tls->ctx->sign_certificate, tls, &algo, sendbuf,
                                                              ptls_iovec_init(data, datalen), signature_algorithms->list,
                                                              signature_algorithms->count)) != 0) {
                        goto Exit;
                    }
                    sendbuf->base[algo_off] = (uint8_t)(algo >> 8);
                    sendbuf->base[algo_off + 1] = (uint8_t)algo;
                });
            });
    }

Exit:
    return ret;
}